

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O1

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *callback,void *userData)

{
  PaStreamParameters *pPVar1;
  int iVar2;
  char *pcVar3;
  PaAlsaStream *self;
  pollfd *ppVar4;
  unsigned_long uVar5;
  PaUtilBufferProcessor *bp;
  PaError PVar6;
  int outputChannelCount;
  PaStreamFlags streamFlags_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  unsigned_long local_80;
  int local_70;
  PaUtilHostBufferSizeMode hostBufferSizeMode;
  PaStreamFlags local_68;
  PaStreamParameters *local_60;
  PaSampleFormat local_58;
  PaSampleFormat local_50;
  PaStream **local_48;
  PaTime outputLatency;
  PaTime inputLatency;
  
  hostBufferSizeMode = paUtilFixedHostBufferSize;
  if ((short)(streamFlags >> 0x10) != 0) {
    return -0x270b;
  }
  outputChannelCount = 0;
  local_60 = outputParameters;
  if (inputParameters == (PaStreamParameters *)0x0) {
    local_50 = 0;
    local_70 = 0;
LAB_0010d931:
    pPVar1 = local_60;
    if (local_60 == (PaStreamParameters *)0x0) {
      local_58 = 0;
    }
    else {
      paUtilErr_ = ValidateParameters(local_60,hostApi,StreamDirection_Out);
      if (paUtilErr_ < 0) {
        pcVar3 = 
        "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2820\n"
        ;
        goto LAB_0010dcf6;
      }
      outputChannelCount = pPVar1->channelCount;
      local_58 = pPVar1->sampleFormat;
    }
    local_80 = framesPerBuffer;
    if (framesPerBuffer == 0) {
      pcVar3 = getenv("PA_ALSA_PERIODSIZE");
      if (pcVar3 == (char *)0x0) {
        local_80 = 0;
      }
      else {
        iVar2 = atoi(pcVar3);
        local_80 = (unsigned_long)iVar2;
      }
    }
    local_48 = s;
    self = (PaAlsaStream *)PaUtil_AllocateMemory(0x388);
    if (self == (PaAlsaStream *)0x0) {
      self = (PaAlsaStream *)0x0;
      PaUtil_DebugPrint(
                       "Expression \'stream = (PaAlsaStream*)PaUtil_AllocateMemory( sizeof(PaAlsaStream) )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2833\n"
                       );
      PVar6 = -0x2708;
      goto LAB_0010dd07;
    }
    local_68 = streamFlags;
    memset(self,0,0x388);
    if (callback == (PaStreamCallback *)0x0) {
      PaUtil_InitializeStreamRepresentation
                ((PaUtilStreamRepresentation *)self,
                 (PaUtilStreamInterface *)&hostApi[2].info.deviceCount,(PaStreamCallback *)0x0,
                 userData);
    }
    else {
      PaUtil_InitializeStreamRepresentation
                ((PaUtilStreamRepresentation *)self,(PaUtilStreamInterface *)(hostApi + 1),callback,
                 userData);
      self->callbackMode = 1;
    }
    self->framesPerUserBuffer = local_80;
    self->neverDropInput = (uint)local_68 & 4;
    memset(&self->capture,0,0x100);
    if ((inputParameters == (PaStreamParameters *)0x0) ||
       (paUtilErr_ = PaAlsaStreamComponent_Initialize
                               (&self->capture,(PaAlsaHostApiRepresentation *)hostApi,
                                inputParameters,StreamDirection_In,
                                (uint)(callback != (PaStreamCallback *)0x0)), -1 < paUtilErr_)) {
      if ((local_60 == (PaStreamParameters *)0x0) ||
         (paUtilErr_ = PaAlsaStreamComponent_Initialize
                                 (&self->playback,(PaAlsaHostApiRepresentation *)hostApi,local_60,
                                  StreamDirection_Out,(uint)(callback != (PaStreamCallback *)0x0)),
         -1 < paUtilErr_)) {
        ppVar4 = (pollfd *)
                 PaUtil_AllocateMemory((ulong)((self->playback).nfds + (self->capture).nfds) << 3);
        streamFlags_00 = local_68;
        self->pfds = ppVar4;
        if (ppVar4 == (pollfd *)0x0) {
          PaUtil_DebugPrint(
                           "Expression \'self->pfds = (struct pollfd*)PaUtil_AllocateMemory( ( self->capture.nfds + self->playback.nfds ) * sizeof( struct pollfd ) )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2176\n"
                           );
          paUtilErr_ = -0x2708;
        }
        else {
          PaUtil_InitializeCpuLoadMeasurer(&self->cpuLoadMeasurer,sampleRate);
          PaUnixMutex_Initialize(&self->stateMtx);
          paUtilErr_ = 0;
        }
      }
      else {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_Initialize( &self->playback, alsaApi, outParams, StreamDirection_Out, NULL != callback )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2170\n"
                         );
        streamFlags_00 = local_68;
      }
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_Initialize( &self->capture, alsaApi, inParams, StreamDirection_In, NULL != callback )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2166\n"
                       );
      streamFlags_00 = local_68;
    }
    if (paUtilErr_ < 0) {
      pcVar3 = 
      "Expression \'PaAlsaStream_Initialize( stream, alsaHostApi, inputParameters, outputParameters, sampleRate, framesPerBuffer, callback, streamFlags, userData )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2835\n"
      ;
    }
    else {
      paUtilErr_ = PaAlsaStream_Configure
                             (self,inputParameters,local_60,sampleRate,local_80,&inputLatency,
                              &outputLatency,&hostBufferSizeMode);
      if (paUtilErr_ < 0) {
        pcVar3 = 
        "Expression \'PaAlsaStream_Configure( stream, inputParameters, outputParameters, sampleRate, framesPerBuffer, &inputLatency, &outputLatency, &hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2838\n"
        ;
      }
      else {
        bp = &self->bufferProcessor;
        paUtilErr_ = PaUtil_InitializeBufferProcessor
                               (bp,local_70,local_50,
                                (ulong)((uint)((self->capture).hostInterleaved == 0) << 0x1f) |
                                (self->capture).hostSampleFormat,outputChannelCount,local_58,
                                (ulong)((uint)((self->playback).hostInterleaved == 0) << 0x1f) |
                                (self->playback).hostSampleFormat,sampleRate,streamFlags_00,local_80
                                ,self->maxFramesPerHostBuffer,hostBufferSizeMode,callback,userData);
        if (-1 < paUtilErr_) {
          if (0 < local_70) {
            uVar5 = PaUtil_GetBufferProcessorInputLatencyFrames(bp);
            auVar7._8_4_ = (int)(uVar5 >> 0x20);
            auVar7._0_8_ = uVar5;
            auVar7._12_4_ = 0x45300000;
            (self->streamRepresentation).streamInfo.inputLatency =
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) / sampleRate +
                 inputLatency;
          }
          if (0 < outputChannelCount) {
            uVar5 = PaUtil_GetBufferProcessorOutputLatencyFrames(bp);
            auVar8._8_4_ = (int)(uVar5 >> 0x20);
            auVar8._0_8_ = uVar5;
            auVar8._12_4_ = 0x45300000;
            (self->streamRepresentation).streamInfo.outputLatency =
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) / sampleRate +
                 outputLatency;
          }
          *local_48 = self;
          return 0;
        }
        pcVar3 = 
        "Expression \'PaUtil_InitializeBufferProcessor( &stream->bufferProcessor, numInputChannels, inputSampleFormat, hostInputSampleFormat, numOutputChannels, outputSampleFormat, hostOutputSampleFormat, sampleRate, streamFlags, framesPerBuffer, stream->maxFramesPerHostBuffer, hostBufferSizeMode, callback, userData )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2846\n"
        ;
      }
    }
  }
  else {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (-1 < paUtilErr_) {
      local_70 = inputParameters->channelCount;
      local_50 = inputParameters->sampleFormat;
      goto LAB_0010d931;
    }
    pcVar3 = 
    "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2813\n"
    ;
LAB_0010dcf6:
    self = (PaAlsaStream *)0x0;
  }
  PaUtil_DebugPrint(pcVar3);
  PVar6 = paUtilErr_;
LAB_0010dd07:
  if (self != (PaAlsaStream *)0x0) {
    PaAlsaStream_Terminate(self);
  }
  return PVar6;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback *streamCallback,
                           void *userData )
{
    PaError result = paNoError;
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;
    PaSkeletonStream *stream = 0;
    unsigned long framesPerHostBuffer = framesPerBuffer; /* these may not be equivalent for all implementations */
    int inputChannelCount, outputChannelCount;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaSampleFormat hostInputSampleFormat, hostOutputSampleFormat;


    if( inputParameters )
    {
        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;

        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that input device can support inputChannelCount */
        if( inputChannelCount > hostApi->deviceInfos[ inputParameters->device ]->maxInputChannels )
            return paInvalidChannelCount;

        /* validate inputStreamInfo */
        if( inputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostInputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, inputSampleFormat );
    }
    else
    {
        inputChannelCount = 0;
        inputSampleFormat = hostInputSampleFormat = paInt16; /* Surpress 'uninitialised var' warnings. */
    }

    if( outputParameters )
    {
        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
        
        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( outputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that output device can support inputChannelCount */
        if( outputChannelCount > hostApi->deviceInfos[ outputParameters->device ]->maxOutputChannels )
            return paInvalidChannelCount;

        /* validate outputStreamInfo */
        if( outputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostOutputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, outputSampleFormat );
    }
    else
    {
        outputChannelCount = 0;
        outputSampleFormat = hostOutputSampleFormat = paInt16; /* Surpress 'uninitialized var' warnings. */
    }

    /*
        IMPLEMENT ME:

        ( the following two checks are taken care of by PaUtil_InitializeBufferProcessor() FIXME - checks needed? )

            - check that input device can support inputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - check that output device can support outputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - if a full duplex stream is requested, check that the combination
                of input and output parameters is supported

            - check that the device supports sampleRate

            - alter sampleRate to a close allowable rate if possible / necessary

            - validate suggestedInputLatency and suggestedOutputLatency parameters,
                use default values where necessary
    */




    /* validate platform specific flags */
    if( (streamFlags & paPlatformSpecificFlags) != 0 )
        return paInvalidFlag; /* unexpected platform specific flag */


    stream = (PaSkeletonStream*)PaUtil_AllocateMemory( sizeof(PaSkeletonStream) );
    if( !stream )
    {
        result = paInsufficientMemory;
        goto error;
    }

    if( streamCallback )
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->callbackStreamInterface, streamCallback, userData );
    }
    else
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->blockingStreamInterface, streamCallback, userData );
    }

    PaUtil_InitializeCpuLoadMeasurer( &stream->cpuLoadMeasurer, sampleRate );


    /* we assume a fixed host buffer size in this example, but the buffer processor
        can also support bounded and unknown host buffer sizes by passing 
        paUtilBoundedHostBufferSize or paUtilUnknownHostBufferSize instead of
        paUtilFixedHostBufferSize below. */
        
    result =  PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
              inputChannelCount, inputSampleFormat, hostInputSampleFormat,
              outputChannelCount, outputSampleFormat, hostOutputSampleFormat,
              sampleRate, streamFlags, framesPerBuffer,
              framesPerHostBuffer, paUtilFixedHostBufferSize,
              streamCallback, userData );
    if( result != paNoError )
        goto error;


    /*
        IMPLEMENT ME: initialise the following fields with estimated or actual
        values.
    */
    stream->streamRepresentation.streamInfo.inputLatency =
            (PaTime)PaUtil_GetBufferProcessorInputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* inputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.outputLatency =
            (PaTime)PaUtil_GetBufferProcessorOutputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* outputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.sampleRate = sampleRate;

    
    /*
        IMPLEMENT ME:
            - additional stream setup + opening
    */

    stream->framesPerHostCallback = framesPerHostBuffer;

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
        PaUtil_FreeMemory( stream );

    return result;
}